

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

int64_t duckdb::Timestamp::GetEpochRounded(timestamp_t input,int64_t power_of_ten)

{
  long lVar1;
  
  lVar1 = input.value / (power_of_ten / 2);
  return (long)(lVar1 + (lVar1 >> 0x3f | 1U)) / 2;
}

Assistant:

int64_t Timestamp::GetEpochRounded(timestamp_t input, int64_t power_of_ten) {
	D_ASSERT(Timestamp::IsFinite(input));
	//	Round away from the epoch.
	//	Scale first so we don't overflow.
	const auto scaling = power_of_ten / 2;
	input.value /= scaling;
	if (input.value < 0) {
		--input.value;
	} else {
		++input.value;
	}
	input.value /= 2;
	return input.value;
}